

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableTest_InsertValueToMap_Test::TestBody(HashtableTest_InsertValueToMap_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  data_type *pdVar4;
  pointer ppVar5;
  AssertionResult *assertion_result;
  pointer ppVar6;
  char *pcVar7;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__2;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  dhm_it;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  dhm;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  shm_it;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  shm;
  type in_stack_fffffffffffff928;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  key_equal *in_stack_fffffffffffff938;
  hasher *in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  int line;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffff950;
  undefined8 in_stack_fffffffffffff958;
  Type type;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  char *in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff998;
  undefined7 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a7;
  AssertionResult *in_stack_fffffffffffff9a8;
  AssertHelper *in_stack_fffffffffffff9b0;
  AssertionResult local_558 [2];
  undefined4 local_534;
  AssertionResult local_530 [2];
  undefined4 local_50c;
  AssertionResult local_508;
  string local_4f8 [48];
  AssertionResult local_4c8;
  int local_4b8 [2];
  pair<const_int,_int> local_4b0;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  local_4a8;
  undefined4 local_478;
  undefined4 local_474;
  AssertionResult local_470 [2];
  undefined4 local_44c;
  AssertionResult local_448 [2];
  undefined4 local_424;
  AssertionResult local_420;
  string local_410 [55];
  byte local_3d9;
  AssertionResult local_3d8;
  int local_3c8 [2];
  pair<const_int,_int> local_3c0;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  local_3b8;
  undefined4 local_394;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  local_390;
  undefined4 local_370;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_36b [99];
  undefined4 local_308;
  undefined4 local_304;
  AssertionResult local_300 [2];
  undefined4 local_2dc;
  AssertionResult local_2d8 [2];
  undefined4 local_2b4;
  AssertionResult local_2b0;
  string local_2a0 [48];
  AssertionResult local_270;
  int local_260 [2];
  pair<int,_int> local_258;
  pair<const_int,_int> local_250 [13];
  undefined4 local_1e8;
  undefined4 local_1e4;
  AssertionResult local_1e0 [2];
  undefined4 local_1bc;
  AssertionResult local_1b8 [2];
  undefined4 local_194;
  AssertionResult local_190;
  string local_180 [55];
  byte local_149;
  AssertionResult local_148;
  int local_138 [2];
  pair<int,_int> local_130;
  pair<const_int,_int> local_128 [11];
  undefined4 local_cc;
  byte local_80;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_63 [99];
  
  type = (Type)((ulong)in_stack_fffffffffffff958 >> 0x20);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_63);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hash_map(in_stack_fffffffffffff950,
                    CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                    in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                    (allocator_type *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930))
  ;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_63);
  std::
  pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  ::
  pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool,_true>
            ((pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
              *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  local_cc = 1;
  pdVar4 = google::
           sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator[]((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                        (key_type *)in_stack_fffffffffffff928);
  *pdVar4 = 2;
  local_138[1] = 1;
  local_138[0] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_130,local_138 + 1,local_138);
  std::pair<const_int,_int>::pair<int,_int,_true>(local_128,&local_130);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::insert((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
           (value_type *)in_stack_fffffffffffff928);
  std::
  pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  ::operator=((pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
               *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
              in_stack_fffffffffffff928);
  local_149 = ~local_80 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (bool *)in_stack_fffffffffffff928,(type *)0x9e034e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_180);
    testing::Message::~Message((Message *)0x9e0479);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e04f4);
  local_194 = 1;
  google::
  sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9e050c);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x9e05b2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e0615);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e066d);
  local_1bc = 2;
  google::
  sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9e0685);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x9e072f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e0792);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e07ea);
  ppVar5 = google::
           sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)0x9e07f7);
  ppVar5->second = 0x14;
  local_1e4 = 0x14;
  local_1e8 = 1;
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator[]((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (key_type *)in_stack_fffffffffffff928);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x9e08e1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e0944);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e099c);
  local_260[1] = 2;
  local_260[0] = 4;
  std::pair<int,_int>::pair<int,_int,_true>(&local_258,local_260 + 1,local_260);
  std::pair<const_int,_int>::pair<int,_int,_true>(local_250,&local_258);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::insert((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
           (value_type *)in_stack_fffffffffffff928);
  std::
  pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  ::operator=((pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
               *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
              in_stack_fffffffffffff928);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (bool *)in_stack_fffffffffffff928,(type *)0x9e0a35);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_2a0);
    testing::Message::~Message((Message *)0x9e0b33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e0bae);
  local_2b4 = 2;
  google::
  sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9e0bc6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x9e0c6c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e0ccf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e0d27);
  local_2dc = 4;
  google::
  sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9e0d3f);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x9e0de9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e0e4c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e0ea4);
  local_304 = 4;
  local_308 = 2;
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator[]((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (key_type *)in_stack_fffffffffffff928);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_300);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x9e0f75);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e0fd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e1030);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_36b);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                    *)in_stack_fffffffffffff950,
                   CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                   in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_36b);
  local_370 = 0;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                  (key_type *)in_stack_fffffffffffff928);
  std::
  pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  ::
  pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool,_true>
            ((pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
              *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  local_394 = 1;
  pdVar4 = google::
           dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                        (key_type *)in_stack_fffffffffffff928);
  *pdVar4 = 2;
  local_3c8[1] = 1;
  local_3c8[0] = 3;
  std::pair<const_int,_int>::pair<int,_int,_true>(&local_3c0,local_3c8 + 1,local_3c8);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::insert((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
           (value_type *)in_stack_fffffffffffff928);
  std::
  pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  ::operator=(&local_390,&local_3b8);
  local_3d9 = ~local_390.second & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (bool *)in_stack_fffffffffffff928,(type *)0x9e1174);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_410);
    testing::Message::~Message((Message *)0x9e12b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e132c);
  local_424 = 1;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9e1344);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_420);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    in_stack_fffffffffffff9b0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x9e13ea);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e144d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e14a5);
  local_44c = 2;
  assertion_result =
       (AssertionResult *)
       google::
       dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x9e14bd);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    in_stack_fffffffffffff998 =
         testing::AssertionResult::failure_message((AssertionResult *)0x9e1561);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e15be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e1616);
  ppVar6 = google::
           dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)0x9e1623);
  ppVar6->second = 0x14;
  local_474 = 0x14;
  local_478 = 1;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (key_type *)in_stack_fffffffffffff928);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_470);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x9e16fb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e1758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e17b0);
  local_4b8[1] = 2;
  local_4b8[0] = 4;
  std::pair<const_int,_int>::pair<int,_int,_true>(&local_4b0,local_4b8 + 1,local_4b8);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::insert((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
           (value_type *)in_stack_fffffffffffff928);
  std::
  pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
  ::operator=(&local_390,&local_4a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (bool *)in_stack_fffffffffffff928,(type *)0x9e1832);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT17(uVar2,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998,(char *)ppVar6);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_4f8);
    testing::Message::~Message((Message *)0x9e192a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e19a2);
  local_50c = 2;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9e19ba);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_508);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff960));
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x9e1a54);
    type = (Type)((ulong)pcVar7 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff960),type,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e1ab1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e1b06);
  local_534 = 4;
  ppVar6 = google::
           dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)0x9e1b1e);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_530);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffff94c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff960));
    in_stack_fffffffffffff940 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x9e1bbc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff960),type,(char *)ppVar6,line,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e1c19);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e1c71);
  pdVar4 = google::
           dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                        (key_type *)in_stack_fffffffffffff928);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(line,in_stack_fffffffffffff948),(char *)in_stack_fffffffffffff940,
             pdVar4,(int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_558);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x9e1d36);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff960),type,(char *)ppVar6,line,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x9e1d91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e1de6);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x9e1df3);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~sparse_hash_map((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)0x9e1e00);
  return;
}

Assistant:

TEST(HashtableTest, InsertValueToMap) {
  // For the maps in particular, ensure that inserting doesn't change
  // the value.
  sparse_hash_map<int, int> shm;
  pair<sparse_hash_map<int, int>::iterator, bool> shm_it;
  shm[1] = 2;  // test a different method of inserting
  shm_it = shm.insert(pair<int, int>(1, 3));
  EXPECT_FALSE(shm_it.second);
  EXPECT_EQ(1, shm_it.first->first);
  EXPECT_EQ(2, shm_it.first->second);
  shm_it.first->second = 20;
  EXPECT_EQ(20, shm[1]);

  shm_it = shm.insert(pair<int, int>(2, 4));
  EXPECT_TRUE(shm_it.second);
  EXPECT_EQ(2, shm_it.first->first);
  EXPECT_EQ(4, shm_it.first->second);
  EXPECT_EQ(4, shm[2]);

  // Do it all again, with dense_hash_map.
  dense_hash_map<int, int> dhm;
  dhm.set_empty_key(0);
  pair<dense_hash_map<int, int>::iterator, bool> dhm_it;
  dhm[1] = 2;  // test a different method of inserting
  dhm_it = dhm.insert(pair<const int, int>(1, 3));
  EXPECT_FALSE(dhm_it.second);
  EXPECT_EQ(1, dhm_it.first->first);
  EXPECT_EQ(2, dhm_it.first->second);
  dhm_it.first->second = 20;
  EXPECT_EQ(20, dhm[1]);

  dhm_it = dhm.insert(pair<const int, int>(2, 4));
  EXPECT_TRUE(dhm_it.second);
  EXPECT_EQ(2, dhm_it.first->first);
  EXPECT_EQ(4, dhm_it.first->second);
  EXPECT_EQ(4, dhm[2]);
}